

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

locale __thiscall
booster::locale::impl_posix::create_formatting
          (impl_posix *this,locale *in,shared_ptr<__locale_struct_*> *lc,character_facet_type type)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  shared_ptr<__locale_struct_*> local_28;
  shared_ptr<__locale_struct_*> local_18;
  
  if (type == 2) {
    local_28.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (lc->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_28.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (lc->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_28.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_28.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_28.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_28.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_28.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi)->_M_use_count + 1;
      }
    }
    create_formatting_impl<wchar_t>(this,in,&local_28);
    this_00._M_pi =
         local_28.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
  }
  else {
    if (type != 1) {
      std::locale::locale((locale *)this,in);
      return (locale)(_Impl *)this;
    }
    local_18.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (lc->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_18.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (lc->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_18.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_18.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_18.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_18.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_18.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi)->_M_use_count + 1;
      }
    }
    create_formatting_impl<char>(this,in,&local_18);
    this_00._M_pi =
         local_18.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
  }
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  return (locale)(_Impl *)this;
}

Assistant:

std::locale create_formatting(  std::locale const &in,
                                booster::shared_ptr<locale_t> lc,
                                character_facet_type type)
{
        switch(type) {
        case char_facet: 
            return create_formatting_impl<char>(in,lc);
        case wchar_t_facet:
            return create_formatting_impl<wchar_t>(in,lc);
        default:
            return in;
        }
}